

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall gl4cts::AdvancedManyDrawCalls::Run(AdvancedManyDrawCalls *this)

{
  bool bVar1;
  GLuint GVar2;
  undefined4 *puVar3;
  GLuint local_148 [2];
  GLuint data [64];
  uint *ptr;
  GLenum draw_buffers [2];
  int i;
  int s;
  char *src_fs;
  char *src_vs;
  AdvancedManyDrawCalls *this_local;
  
  GVar2 = gl4cts::anon_unknown_0::SACSubcaseBase::CreateProgram
                    (&this->super_SACSubcaseBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_vertex;\nvoid main() {\n  gl_Position = i_vertex;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,
                     "#version 420 core\nlayout(location = 0) out uvec4 o_color[2];\nlayout(binding = 0, offset = 0) uniform atomic_uint ac_counter_inc;\nlayout(binding = 0, offset = 4) uniform atomic_uint ac_counter_dec;\nvoid main() {\n  o_color[0] = uvec4(atomicCounterIncrement(ac_counter_inc));\n  o_color[1] = uvec4(atomicCounterDecrement(ac_counter_dec));\n}"
                     ,true);
  this->prog_ = GVar2;
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->counter_buffer_);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,this->counter_buffer_);
  glu::CallLogWrapper::glBufferData
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,8,(void *)0x0,0x88ea);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,0);
  draw_buffers[1] = 8;
  glu::CallLogWrapper::glGenTextures
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,2,
             this->rt_);
  for (draw_buffers[0] = 0; (int)draw_buffers[0] < 2; draw_buffers[0] = draw_buffers[0] + 1) {
    glu::CallLogWrapper::glBindTexture
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0xde1,this->rt_[(int)draw_buffers[0]]);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0xde1,0,0x8236,8,8,0,0x8d94,0x1405,(void *)0x0);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0xde1,0);
  }
  glu::CallLogWrapper::glGenFramebuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->fbo_);
  glu::CallLogWrapper::glBindFramebuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8d40,this->fbo_);
  glu::CallLogWrapper::glFramebufferTexture
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8d40,0x8ce0,this->rt_[0],0);
  glu::CallLogWrapper::glFramebufferTexture
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8d40,0x8ce1,this->rt_[1],0);
  ptr = (uint *)0x8ce100008ce0;
  glu::CallLogWrapper::glDrawBuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,2,
             (GLenum *)&ptr);
  glu::CallLogWrapper::glBindFramebuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8d40,0);
  gl4cts::anon_unknown_0::SACSubcaseBase::CreateQuad
            (&this->super_SACSubcaseBase,&this->vao_,&this->vbo_,(GLuint *)0x0);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,this->counter_buffer_);
  puVar3 = (undefined4 *)
           glu::CallLogWrapper::glMapBufferRange
                     (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                       super_CallLogWrapper,0x92c0,0,8,10);
  *puVar3 = 0;
  puVar3[1] = 0x100;
  glu::CallLogWrapper::glUnmapBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0);
  glu::CallLogWrapper::glBindFramebuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8d40,this->fbo_);
  glu::CallLogWrapper::glViewport
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0,
             0,8,8);
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,0,this->counter_buffer_);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->prog_);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->vao_);
  glu::CallLogWrapper::glDrawArrays
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,5,
             0,4);
  glu::CallLogWrapper::glMemoryBarrier
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x1000);
  glu::CallLogWrapper::glDrawArrays
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,5,
             0,4);
  glu::CallLogWrapper::glMemoryBarrier
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x1000);
  glu::CallLogWrapper::glDrawArrays
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,5,
             0,4);
  glu::CallLogWrapper::glMemoryBarrier
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x1000);
  glu::CallLogWrapper::glDrawArrays
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,5,
             0,4);
  glu::CallLogWrapper::glReadBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8ce0);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0,
             0,8,8,0x8d94,0x1405,local_148);
  bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                    (&this->super_SACSubcaseBase,0x40,local_148,0xc0);
  if (bVar1) {
    glu::CallLogWrapper::glReadBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8ce1);
    glu::CallLogWrapper::glReadPixels
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0,0,8,8,0x8d94,0x1405,local_148);
    bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      (&this->super_SACSubcaseBase,0x40,local_148,0);
    if (bVar1) {
      bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                        (&this->super_SACSubcaseBase,this->counter_buffer_,0,0x100);
      if (bVar1) {
        bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                          (&this->super_SACSubcaseBase,this->counter_buffer_,4,0);
        if (bVar1) {
          this_local = (AdvancedManyDrawCalls *)0x0;
        }
        else {
          this_local = (AdvancedManyDrawCalls *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (AdvancedManyDrawCalls *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (AdvancedManyDrawCalls *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AdvancedManyDrawCalls *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		// create program
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_vertex;" NL "void main() {" NL
							 "  gl_Position = i_vertex;" NL "}";
		const char* src_fs = "#version 420 core" NL "layout(location = 0) out uvec4 o_color[2];" NL
							 "layout(binding = 0, offset = 0) uniform atomic_uint ac_counter_inc;" NL
							 "layout(binding = 0, offset = 4) uniform atomic_uint ac_counter_dec;" NL "void main() {" NL
							 "  o_color[0] = uvec4(atomicCounterIncrement(ac_counter_inc));" NL
							 "  o_color[1] = uvec4(atomicCounterDecrement(ac_counter_dec));" NL "}";
		prog_ = CreateProgram(src_vs, NULL, NULL, NULL, src_fs, true);

		// create atomic counter buffer
		glGenBuffers(1, &counter_buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 8, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		// create render targets
		const int s = 8;
		glGenTextures(2, rt_);

		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, rt_[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_R32UI, s, s, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, NULL);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		// create fbo
		glGenFramebuffers(1, &fbo_);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, rt_[0], 0);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, rt_[1], 0);
		const GLenum draw_buffers[2] = { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };
		glDrawBuffers(2, draw_buffers);
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		// create geometry
		CreateQuad(&vao_, &vbo_, NULL);

		// init counter buffer
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		unsigned int* ptr = static_cast<unsigned int*>(
			glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 8, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT));
		*ptr++ = 0;
		*ptr++ = 256;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		// draw
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glViewport(0, 0, s, s);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_);
		glUseProgram(prog_);
		glBindVertexArray(vao_);

		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		glMemoryBarrier(GL_ATOMIC_COUNTER_BARRIER_BIT);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		glMemoryBarrier(GL_ATOMIC_COUNTER_BARRIER_BIT);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		glMemoryBarrier(GL_ATOMIC_COUNTER_BARRIER_BIT);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		// validate
		GLuint data[s * s];
		glReadBuffer(GL_COLOR_ATTACHMENT0);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		if (!CheckCounterValues(s * s, data, s * s * 3))
			return ERROR;

		glReadBuffer(GL_COLOR_ATTACHMENT1);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		if (!CheckCounterValues(s * s, data, 0))
			return ERROR;

		if (!CheckFinalCounterValue(counter_buffer_, 0, 256))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 4, 0))
			return ERROR;

		return NO_ERROR;
	}